

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.cpp
# Opt level: O1

bool __thiscall hmm::createMaps(hmm *this)

{
  char cVar1;
  char cVar2;
  mapped_type mVar3;
  char *__nptr;
  int iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  int *piVar7;
  long lVar8;
  mapped_type *pmVar9;
  int iVar10;
  bool bVar11;
  ulong uVar12;
  char *__end;
  double dVar13;
  string previousCount2;
  string previousCount1;
  char *local_c0;
  ulong local_b8;
  char local_b0 [16];
  undefined1 *local_a0;
  char *local_98;
  undefined1 local_90 [16];
  char *local_80;
  char *local_78;
  char local_70 [16];
  _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_60;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_50;
  _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  hmm *local_38;
  
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"0","");
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"0","");
  if ((this->code1)._M_string_length == 0) {
    iVar10 = 0;
  }
  else {
    local_40 = (_Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->observedChroma1;
    local_48 = (_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->qualityMap1;
    local_50 = (_Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->observedChroma2;
    local_60 = (_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->qualityMap2;
    local_58 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->distanceMap;
    uVar12 = 0;
    iVar10 = 0;
    local_38 = this;
    do {
      if ((((this->qual1)._M_string_length <= uVar12) || ((this->code2)._M_string_length <= uVar12))
         || ((this->qual2)._M_string_length <= uVar12)) break;
      cVar1 = (this->code1)._M_dataplus._M_p[uVar12];
      if ((cVar1 == 'O') || (cVar1 == 'C')) {
        cVar2 = (this->code2)._M_dataplus._M_p[uVar12];
        if ((((cVar2 != 'O') && (cVar2 != 'C')) || (local_78 != local_98)) ||
           ((local_78 != (char *)0x0 &&
            (iVar4 = bcmp(local_80,local_a0,(size_t)local_78), iVar4 != 0)))) {
          bVar11 = false;
          goto LAB_0015f456;
        }
        if (iVar10 != 0) {
          iVar10 = iVar10 + 1;
          local_c0 = (char *)CONCAT44(local_c0._4_4_,iVar10);
          pmVar5 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_40,(key_type *)&local_c0);
          *pmVar5 = cVar1;
          if ((this->qual1)._M_string_length <= uVar12) goto LAB_0015f492;
          dVar13 = pow(10.0,(double)-(int)(this->qual1)._M_dataplus._M_p[uVar12] / 10.0);
          local_c0 = (char *)CONCAT44(local_c0._4_4_,iVar10);
          pmVar6 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_48,(key_type *)&local_c0);
          *pmVar6 = dVar13;
          if ((this->code2)._M_string_length <= uVar12) goto LAB_0015f492;
          mVar3 = (this->code2)._M_dataplus._M_p[uVar12];
          local_c0 = (char *)CONCAT44(local_c0._4_4_,iVar10);
          pmVar5 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_50,(key_type *)&local_c0);
          *pmVar5 = mVar3;
          if ((this->qual2)._M_string_length <= uVar12) goto LAB_0015f492;
          dVar13 = pow(10.0,(double)-(int)(this->qual2)._M_dataplus._M_p[uVar12] / 10.0);
          local_c0 = (char *)CONCAT44(local_c0._4_4_,iVar10);
          pmVar6 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_60,(key_type *)&local_c0);
          __nptr = local_80;
          *pmVar6 = dVar13;
          piVar7 = __errno_location();
          iVar4 = *piVar7;
          *piVar7 = 0;
          lVar8 = strtol(__nptr,&local_c0,10);
          if (local_c0 != __nptr) {
            if (((int)lVar8 == lVar8) && (*piVar7 != 0x22)) {
              if (*piVar7 == 0) {
                *piVar7 = iVar4;
              }
              local_c0 = (char *)CONCAT44(local_c0._4_4_,iVar10);
              pmVar9 = std::__detail::
                       _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[](local_58,(key_type *)&local_c0);
              *pmVar9 = (int)lVar8;
              std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x199db0);
              this = local_38;
              std::__cxx11::string::_M_replace((ulong)&local_a0,0,local_98,0x199db0);
              goto LAB_0015f426;
            }
            std::__throw_out_of_range("stoi");
          }
          std::__throw_invalid_argument("stoi");
LAB_0015f4bb:
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar12);
        }
        local_c0 = (char *)CONCAT44(local_c0._4_4_,1);
        pmVar9 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_58,(key_type *)&local_c0);
        *pmVar9 = 0;
        if ((this->code1)._M_string_length <= uVar12) {
LAB_0015f492:
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar12);
        }
        mVar3 = (this->code1)._M_dataplus._M_p[uVar12];
        local_c0 = (char *)CONCAT44(local_c0._4_4_,1);
        pmVar5 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_40,(key_type *)&local_c0);
        *pmVar5 = mVar3;
        if ((this->qual1)._M_string_length <= uVar12) goto LAB_0015f492;
        dVar13 = pow(10.0,(double)-(int)(this->qual1)._M_dataplus._M_p[uVar12] / 10.0);
        local_c0 = (char *)CONCAT44(local_c0._4_4_,1);
        pmVar6 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_48,(key_type *)&local_c0);
        *pmVar6 = dVar13;
        if ((this->code2)._M_string_length <= uVar12) goto LAB_0015f492;
        mVar3 = (this->code2)._M_dataplus._M_p[uVar12];
        local_c0 = (char *)CONCAT44(local_c0._4_4_,1);
        pmVar5 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_50,(key_type *)&local_c0);
        *pmVar5 = mVar3;
        if ((this->qual2)._M_string_length <= uVar12) goto LAB_0015f492;
        dVar13 = pow(10.0,(double)-(int)(this->qual2)._M_dataplus._M_p[uVar12] / 10.0);
        local_c0 = (char *)CONCAT44(local_c0._4_4_,1);
        pmVar6 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_60,(key_type *)&local_c0);
        *pmVar6 = dVar13;
        std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x199db0);
        iVar10 = 1;
        std::__cxx11::string::_M_replace((ulong)&local_a0,0,local_98,0x199db0);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_80);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_a0), iVar4 == 0))
        {
          if (((this->code1)._M_string_length <= uVar12) ||
             (std::__cxx11::string::_M_replace_aux((ulong)&local_80,0,(ulong)local_78,'\x01'),
             (this->code2)._M_string_length <= uVar12)) goto LAB_0015f492;
          std::__cxx11::string::_M_replace_aux((ulong)&local_a0,0,(ulong)local_98,'\x01');
        }
        else {
          if ((this->code1)._M_string_length <= uVar12) goto LAB_0015f4bb;
          local_c0 = local_b0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,local_80,local_78 + (long)local_80);
          std::__cxx11::string::_M_replace_aux((ulong)&local_c0,local_b8,0,'\x01');
          std::__cxx11::string::operator=((string *)&local_80,(string *)&local_c0);
          if (local_c0 != local_b0) {
            operator_delete(local_c0);
          }
          if ((this->code2)._M_string_length <= uVar12) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar12)
            ;
          }
          local_c0 = local_b0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,local_a0,local_98 + (long)local_a0);
          std::__cxx11::string::_M_replace_aux((ulong)&local_c0,local_b8,0,'\x01');
          std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
          if (local_c0 != local_b0) {
            operator_delete(local_c0);
          }
        }
      }
LAB_0015f426:
      uVar12 = uVar12 + 1;
    } while (uVar12 < (this->code1)._M_string_length);
  }
  this->T = iVar10;
  bVar11 = this->minGCPositions <= iVar10;
LAB_0015f456:
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  return bVar11;
}

Assistant:

bool hmm::createMaps(){
    int i = 0;
    int numGCPos = 0;
    string previousCount1 = "0";
    string previousCount2 = "0";
    //cout<<"here1"<<endl;
    while(i<this->code1.size() && i<this->qual1.size() && i<this->code2.size() && i<this->qual2.size()){
        //cout<<"here2: "<<i<<endl;
        if(this->code1.at(i)=='O'||this->code1.at(i)=='C'){
            if(this->code2.at(i)=='O'||this->code2.at(i)=='C'){
                if(previousCount1!=previousCount2){
                    return false;
                }
                if(numGCPos==0){
                    distanceMap[numGCPos+1] = (0);
                    observedChroma1[numGCPos+1] = (this->code1.at(i));
                    this->qualityMap1[numGCPos+1] = (pow(10,(-this->qual1.at(i)/(double)10)));
                    //qualityMap1.push_back(qual1.at(i));
                    observedChroma2[numGCPos+1] = (this->code2.at(i));
                    qualityMap2[numGCPos+1] = (pow(10,(-this->qual2.at(i)/(double)10)));
                    //qualityMap2.push_back(qual2.at(i));
                    previousCount1 = "0";
                    previousCount2 = "0";
                    numGCPos += 1;
                    i++;
                    continue;
                }
                observedChroma1[numGCPos+1] = (this->code1.at(i));
                qualityMap1[numGCPos+1] = (pow(10,(-this->qual1.at(i)/(double)10)));
                //qualityMap1.push_back(qual1.at(i));
                observedChroma2[numGCPos+1] = (this->code2.at(i));
                qualityMap2[numGCPos+1] = (pow(10,(-this->qual2.at(i)/(double)10)));
                //qualityMap2.push_back(qual2.at(i));
                distanceMap[numGCPos+1] = std::stoi(previousCount1);
                numGCPos += 1;
                previousCount1 = "0";
                previousCount2 = "0";
            }else{
                return false;
            }
        }else{
            if(previousCount1=="0"||previousCount2=="0"){
                previousCount1 = code1.at(i);
                previousCount2 = code2.at(i);
            }else{
                previousCount1 = previousCount1 + code1.at(i);
                previousCount2 = previousCount2 + code2.at(i);
            }
        }
        i++;
    }
    T = numGCPos;
    if(T<this->minGCPositions){
        return false;
    }
    return true;
}